

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall
DBaseStatusBar::GetCurrentAmmo
          (DBaseStatusBar *this,AAmmo **ammo1,AAmmo **ammo2,int *ammocount1,int *ammocount2)

{
  AAmmo *pAVar1;
  int local_40;
  int local_3c;
  int *ammocount2_local;
  int *ammocount1_local;
  AAmmo **ammo2_local;
  AAmmo **ammo1_local;
  DBaseStatusBar *this_local;
  
  if (this->CPlayer->ReadyWeapon == (AWeapon *)0x0) {
    *ammo2 = (AAmmo *)0x0;
    *ammo1 = (AAmmo *)0x0;
  }
  else {
    pAVar1 = ::TObjPtr::operator_cast_to_AAmmo_((TObjPtr *)&this->CPlayer->ReadyWeapon->Ammo1);
    *ammo1 = pAVar1;
    pAVar1 = ::TObjPtr::operator_cast_to_AAmmo_((TObjPtr *)&this->CPlayer->ReadyWeapon->Ammo2);
    *ammo2 = pAVar1;
    if (*ammo1 == (AAmmo *)0x0) {
      *ammo1 = *ammo2;
      *ammo2 = (AAmmo *)0x0;
    }
  }
  if (*ammo1 == (AAmmo *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = ((*ammo1)->super_AInventory).Amount;
  }
  *ammocount1 = local_3c;
  if (*ammo2 == (AAmmo *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = ((*ammo2)->super_AInventory).Amount;
  }
  *ammocount2 = local_40;
  return;
}

Assistant:

void DBaseStatusBar::GetCurrentAmmo (AAmmo *&ammo1, AAmmo *&ammo2, int &ammocount1, int &ammocount2) const
{
	if (CPlayer->ReadyWeapon != NULL)
	{
		ammo1 = CPlayer->ReadyWeapon->Ammo1;
		ammo2 = CPlayer->ReadyWeapon->Ammo2;
		if (ammo1 == NULL)
		{
			ammo1 = ammo2;
			ammo2 = NULL;
		}
	}
	else
	{
		ammo1 = ammo2 = NULL;
	}
	ammocount1 = ammo1 != NULL ? ammo1->Amount : 0;
	ammocount2 = ammo2 != NULL ? ammo2->Amount : 0;
}